

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int TabItemComparerBySection(void *lhs,void *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((char)*(uint *)((long)lhs + 4) < '\0') + 1;
  if ((*(uint *)((long)lhs + 4) & 0x40) != 0) {
    iVar1 = 0;
  }
  iVar2 = ((char)*(uint *)((long)rhs + 4) < '\0') + 1;
  if ((*(uint *)((long)rhs + 4) & 0x40) != 0) {
    iVar2 = 0;
  }
  iVar1 = iVar1 - iVar2;
  if (iVar1 == 0) {
    iVar1 = (int)*(char *)((long)lhs + 0x1f) - (int)*(char *)((long)rhs + 0x1f);
  }
  return iVar1;
}

Assistant:

static int IMGUI_CDECL TabItemComparerBySection(const void* lhs, const void* rhs)
{
    const ImGuiTabItem* a = (const ImGuiTabItem*)lhs;
    const ImGuiTabItem* b = (const ImGuiTabItem*)rhs;
    const int a_section = (a->Flags & ImGuiTabItemFlags_Leading) ? 0 : (a->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
    const int b_section = (b->Flags & ImGuiTabItemFlags_Leading) ? 0 : (b->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
    if (a_section != b_section)
        return a_section - b_section;
    return (int)(a->IndexDuringLayout - b->IndexDuringLayout);
}